

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O1

uint8_t * __thiscall
CoreML::Specification::ArrayFeatureType::_InternalSerialize
          (ArrayFeatureType *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong *puVar1;
  ArrayFeatureType_EnumeratedShapes *this_00;
  ArrayFeatureType_ShapeRange *this_01;
  void *data;
  bool bVar2;
  LogMessage *other;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  byte *pbVar8;
  ulong *puVar9;
  undefined8 *puVar10;
  size_t __n;
  int32_t iVar11;
  DefaultOptionalValueUnion DVar12;
  LogFinisher local_69;
  LogMessage local_68;
  
  uVar7 = (this->_shape_cached_byte_size_).super___atomic_base<int>._M_i;
  if (0 < (int)uVar7) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    if (stream->end_ <= target) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(&local_69,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    *target = 10;
    pbVar8 = target + 1;
    uVar6 = uVar7;
    if (0x7f < uVar7) {
      do {
        target = pbVar8;
        *target = (byte)uVar6 | 0x80;
        uVar7 = uVar6 >> 7;
        pbVar8 = target + 1;
        bVar2 = 0x3fff < uVar6;
        uVar6 = uVar7;
      } while (bVar2);
    }
    target = target + 2;
    *pbVar8 = (byte)uVar7;
    puVar9 = (ulong *)(this->shape_).arena_or_elements_;
    puVar1 = puVar9 + (this->shape_).current_size_;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar3 = *puVar9;
      *target = (byte)uVar3;
      if (uVar3 < 0x80) {
        pbVar8 = target + 1;
      }
      else {
        *target = (byte)uVar3 | 0x80;
        target[1] = (byte)(uVar3 >> 7);
        pbVar8 = target + 2;
        if (0x3fff < uVar3) {
          uVar5 = (ulong)target[1];
          uVar3 = uVar3 >> 7;
          do {
            pbVar8[-1] = (byte)uVar5 | 0x80;
            uVar4 = uVar3 >> 7;
            *pbVar8 = (byte)uVar4;
            pbVar8 = pbVar8 + 1;
            uVar5 = uVar4 & 0xffffffff;
            bVar2 = 0x3fff < uVar3;
            uVar3 = uVar4;
          } while (bVar2);
        }
      }
      target = pbVar8;
      puVar9 = puVar9 + 1;
    } while (puVar9 < puVar1);
  }
  if (this->datatype_ != 0) {
    pbVar8 = target;
    if (stream->end_ <= target) {
      pbVar8 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = this->datatype_;
    *pbVar8 = 0x10;
    pbVar8[1] = (byte)uVar7;
    if ((ulong)(long)(int)uVar7 < 0x80) {
      target = pbVar8 + 2;
    }
    else {
      pbVar8[1] = (byte)uVar7 | 0x80;
      uVar3 = (ulong)(long)(int)uVar7 >> 7;
      pbVar8[2] = (byte)uVar3;
      target = pbVar8 + 3;
      if (0x3fff < uVar7) {
        uVar5 = (ulong)pbVar8[2];
        do {
          target[-1] = (byte)uVar5 | 0x80;
          uVar4 = uVar3 >> 7;
          *target = (byte)uVar4;
          target = target + 1;
          uVar5 = uVar4 & 0xffffffff;
          bVar2 = 0x3fff < uVar3;
          uVar3 = uVar4;
        } while (bVar2);
      }
    }
  }
  if (this->_oneof_case_[0] == 0x15) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_00 = (this->ShapeFlexibility_).enumeratedshapes_;
    target[0] = 0xaa;
    target[1] = 1;
    uVar7 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[2] = (byte)uVar7;
    if (uVar7 < 0x80) {
      pbVar8 = target + 3;
    }
    else {
      pbVar8 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar7,target + 2);
    }
    target = ArrayFeatureType_EnumeratedShapes::_InternalSerialize(this_00,pbVar8,stream);
  }
  if (this->_oneof_case_[0] == 0x1f) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    this_01 = (this->ShapeFlexibility_).shaperange_;
    target[0] = 0xfa;
    target[1] = 1;
    uVar7 = (this_01->_cached_size_).size_.super___atomic_base<int>._M_i;
    target[2] = (byte)uVar7;
    if (uVar7 < 0x80) {
      pbVar8 = target + 3;
    }
    else {
      pbVar8 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArrayOutOfLineHelper
                         (uVar7,target + 2);
    }
    target = ArrayFeatureType_ShapeRange::_InternalSerialize(this_01,pbVar8,stream);
  }
  pbVar8 = target;
  if (this->_oneof_case_[1] == 0x29) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar7 = 0;
    if (this->_oneof_case_[1] == 0x29) {
      uVar7 = (this->defaultOptionalValue_).intdefaultvalue_;
    }
    target[0] = 200;
    target[1] = 2;
    target[2] = (byte)uVar7;
    if (uVar7 < 0x80) {
      pbVar8 = target + 3;
    }
    else {
      target[2] = (byte)uVar7 | 0x80;
      target[3] = (byte)((ulong)(long)(int)uVar7 >> 7);
      pbVar8 = target + 4;
      if (0x3fff < uVar7) {
        uVar5 = (ulong)target[3];
        uVar3 = (ulong)(long)(int)uVar7 >> 7;
        do {
          pbVar8[-1] = (byte)uVar5 | 0x80;
          uVar4 = uVar3 >> 7;
          *pbVar8 = (byte)uVar4;
          pbVar8 = pbVar8 + 1;
          uVar5 = uVar4 & 0xffffffff;
          bVar2 = 0x3fff < uVar3;
          uVar3 = uVar4;
        } while (bVar2);
      }
    }
  }
  if (this->_oneof_case_[1] == 0x33) {
    if (stream->end_ <= pbVar8) {
      pbVar8 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar8);
    }
    if (this->_oneof_case_[1] == 0x33) {
      iVar11 = (this->defaultOptionalValue_).intdefaultvalue_;
    }
    else {
      iVar11 = 0;
    }
    pbVar8[0] = 0x9d;
    pbVar8[1] = 3;
    *(int32_t *)(pbVar8 + 2) = iVar11;
    pbVar8 = pbVar8 + 6;
  }
  if (this->_oneof_case_[1] == 0x3d) {
    if (stream->end_ <= pbVar8) {
      pbVar8 = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar8);
    }
    if (this->_oneof_case_[1] == 0x3d) {
      DVar12 = this->defaultOptionalValue_;
    }
    else {
      DVar12.doubledefaultvalue_ = 0.0;
    }
    pbVar8[0] = 0xe9;
    pbVar8[1] = 3;
    ((DefaultOptionalValueUnion *)(pbVar8 + 2))->doubledefaultvalue_ = (double)DVar12;
    pbVar8 = pbVar8 + 10;
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    data = *(void **)((uVar3 & 0xfffffffffffffffc) + 8);
    uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar3 & 1) == 0) {
      puVar10 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
      if ((google::protobuf::internal::init_protobuf_defaults_state & 1) == 0) {
        google::protobuf::internal::InitProtobufDefaultsSlow();
      }
    }
    else {
      puVar10 = (undefined8 *)((uVar3 & 0xfffffffffffffffc) + 8);
    }
    __n = (size_t)(int)puVar10[1];
    if ((long)stream->end_ - (long)pbVar8 < (long)__n) {
      pbVar8 = google::protobuf::io::EpsCopyOutputStream::WriteRawFallback
                         (stream,data,(int)puVar10[1],pbVar8);
    }
    else {
      memcpy(pbVar8,data,__n);
      pbVar8 = pbVar8 + __n;
    }
  }
  return pbVar8;
}

Assistant:

uint8_t* ArrayFeatureType::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.ArrayFeatureType)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 shape = 1;
  {
    int byte_size = _shape_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteInt64Packed(
          1, _internal_shape(), byte_size, target);
    }
  }

  // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
  if (this->_internal_datatype() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      2, this->_internal_datatype(), target);
  }

  // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
  if (_internal_has_enumeratedshapes()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        21, _Internal::enumeratedshapes(this), target, stream);
  }

  // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
  if (_internal_has_shaperange()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        31, _Internal::shaperange(this), target, stream);
  }

  // int32 intDefaultValue = 41;
  if (_internal_has_intdefaultvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(41, this->_internal_intdefaultvalue(), target);
  }

  // float floatDefaultValue = 51;
  if (_internal_has_floatdefaultvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(51, this->_internal_floatdefaultvalue(), target);
  }

  // double doubleDefaultValue = 61;
  if (_internal_has_doubledefaultvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(61, this->_internal_doubledefaultvalue(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.ArrayFeatureType)
  return target;
}